

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<char,_bool>::streamReconstructedExpression
          (BinaryExpr<char,_bool> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  undefined4 *puVar2;
  char in_DL;
  string *in_R9;
  StringRef op;
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined1 auStack_44 [12];
  string local_38;
  
  StringMaker<char,void>::convert_abi_cxx11_
            (&local_38,
             (StringMaker<char,void> *)
             (ulong)(uint)(int)(char)(this->super_ITransientExpression).field_0xa,in_DL);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  if (this->m_rhs == true) {
    puVar2 = (undefined4 *)auStack_44;
    local_48 = 0x65757274;
    local_50 = 4;
  }
  else {
    puVar2 = (undefined4 *)((long)auStack_44 + 1);
    auStack_44[0] = 0x65;
    local_48 = 0x736c6166;
    local_50 = 5;
  }
  *(undefined1 *)puVar2 = 0;
  op.m_size = (size_type)&local_58;
  op.m_start = pcVar1;
  local_58 = &local_48;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_38,lhs,op,in_R9);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT44(auStack_44._0_4_,local_48) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }